

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilers.cc
# Opt level: O2

void __thiscall
tchecker::details::
rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
::visit(rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
        *this,typed_par_expression_t *expr)

{
  typed_expression_t *ptVar1;
  allocator<char> local_39;
  string local_38;
  
  if ((expr->super_typed_expression_t)._type == EXPR_TYPE_BAD) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"a parenthesized",&local_39);
    invalid_expression(this,&expr->super_typed_expression_t,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  ptVar1 = typed_par_expression_t::expr(expr);
  (**(code **)(*(long *)ptVar1 + 0x30))(ptVar1,this);
  return;
}

Assistant:

virtual void visit(tchecker::typed_par_expression_t const & expr)
  {
    if (expr.type() == tchecker::EXPR_TYPE_BAD)
      invalid_expression(expr, "a parenthesized");

    // Write bytecode
    expr.expr().visit(*this);
  }